

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strscpy.c
# Opt level: O0

ssize_t uv__strscpy(char *d,char *s,size_t n)

{
  char cVar1;
  ulong local_38;
  ulong local_30;
  size_t i;
  size_t n_local;
  char *s_local;
  char *d_local;
  
  local_30 = 0;
  while( true ) {
    if (n <= local_30) {
      if (local_30 == 0) {
        d_local = (char *)0x0;
      }
      else {
        (d + -1)[local_30] = '\0';
        d_local = (char *)0xfffffffffffffff9;
      }
      return (ssize_t)d_local;
    }
    cVar1 = s[local_30];
    d[local_30] = cVar1;
    if (cVar1 == '\0') break;
    local_30 = local_30 + 1;
  }
  if (local_30 < 0x8000000000000000) {
    local_38 = local_30;
  }
  else {
    local_38 = 0xfffffffffffffff9;
  }
  return local_38;
}

Assistant:

ssize_t uv__strscpy(char* d, const char* s, size_t n) {
  size_t i;

  for (i = 0; i < n; i++)
    if ('\0' == (d[i] = s[i]))
      return i > SSIZE_MAX ? UV_E2BIG : (ssize_t) i;

  if (i == 0)
    return 0;

  d[--i] = '\0';

  return UV_E2BIG;
}